

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

int64_t docio_read_doc(docio_handle *handle,uint64_t offset,docio_object *doc,
                      bool read_on_cache_miss)

{
  uint32_t *puVar1;
  err_log_callback *log_callback;
  undefined8 uVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  byte bVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  void *pvVar8;
  uint32_t *puVar9;
  fdb_status status;
  char *pcVar10;
  uint16_t uVar11;
  uint8_t *buf;
  size_t sVar12;
  filemgr *pfVar13;
  char *pcVar14;
  ulong __size;
  bool key_alloc;
  bool bVar15;
  bool bVar16;
  bool meta_alloc;
  bool body_alloc;
  undefined1 auVar17 [16];
  docio_length dVar18;
  ulong uVar19;
  void *local_80;
  timestamp_t _timestamp;
  fdb_seqnum_t _seqnum;
  docio_length _length;
  uint32_t crc_file;
  undefined1 local_48 [16];
  
  _length.keylen = 0;
  _length.metalen = 0;
  _length.bodylen = 0;
  _length.bodylen_ondisk = 0;
  _length.flag = '\0';
  _length.checksum = '\0';
  _length.reserved = 0;
  log_callback = handle->log_callback;
  uVar7 = _docio_read_length(handle,offset,&_length,log_callback,read_on_cache_miss);
  dVar18 = _length;
  if ((long)uVar7 < 0) {
    if (!read_on_cache_miss) {
      return uVar7;
    }
    pfVar13 = handle->file;
    pcVar14 = "Error in reading the doc length metadata with offset %lu from a database file \'%s\'"
    ;
    sVar12 = 0x4dc;
LAB_00110b75:
    fdb_log_impl(log_callback,2,(fdb_status)uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc",sVar12,pcVar14,offset,pfVar13->filename);
    return uVar7;
  }
  local_48 = (undefined1  [16])0x0;
  uVar4 = _length.checksum;
  auVar17[0] = -((char)_length.keylen == '\0');
  auVar17[1] = -(_length.keylen._1_1_ == '\0');
  auVar17[2] = -((char)_length.metalen == '\0');
  auVar17[3] = -(_length.metalen._1_1_ == '\0');
  auVar17[4] = -((char)_length.bodylen == '\0');
  auVar17[5] = -(_length.bodylen._1_1_ == '\0');
  auVar17[6] = -(_length.bodylen._2_1_ == '\0');
  auVar17[7] = -(_length.bodylen._3_1_ == '\0');
  auVar17[8] = -((char)_length.bodylen_ondisk == '\0');
  auVar17[9] = -(_length.bodylen_ondisk._1_1_ == '\0');
  auVar17[10] = -(_length.bodylen_ondisk._2_1_ == '\0');
  auVar17[0xb] = -(_length.bodylen_ondisk._3_1_ == '\0');
  auVar17[0xc] = -(_length.flag == '\0');
  auVar17[0xd] = -(_length.checksum == '\0');
  auVar17[0xe] = -((char)_length.reserved == '\0');
  auVar17[0xf] = -(_length.reserved._1_1_ == '\0');
  if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf)
      == 0xffff) {
    (doc->length).keylen = 0;
    (doc->length).metalen = 0;
    (doc->length).bodylen = 0;
    (doc->length).bodylen_ondisk = 0;
    (doc->length).flag = '\0';
    (doc->length).checksum = '\0';
    (doc->length).reserved = 0;
    return 0;
  }
  uVar2 = _length._0_8_;
  uVar3 = _length._8_8_;
  bVar5 = _docio_length_checksum(_length,handle);
  if (bVar5 != uVar4) {
    fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc",0x4f1,
                 "doc_length body checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                 ,handle->file->filename,(ulong)bVar5,(ulong)uVar3 >> 0x28 & 0xff,uVar2 & 0xffff,
                 (ulong)uVar2 >> 0x10 & 0xffff,(ulong)uVar2 >> 0x20,uVar3,offset);
    return -0xf;
  }
  dVar18 = _docio_length_decode(dVar18);
  uVar19 = dVar18._0_8_;
  doc->length = dVar18;
  __size = uVar19 >> 0x20;
  uVar11 = dVar18.metalen;
  if ((dVar18._8_8_ >> 0x24 & 1) != 0) {
    if ((__size == 0 && (dVar18.keylen == 0 && uVar11 == 0)) && dVar18.bodylen_ondisk == 0) {
      uVar7 = _docio_read_doc_component(handle,uVar7,8,&_seqnum,log_callback);
      if ((long)uVar7 < 0) {
        pfVar13 = handle->file;
        pcVar14 = 
        "Error in reading an offset of a committed doc from an offset %lu in a database file \'%s\'"
        ;
        sVar12 = 0x50d;
        goto LAB_00110b75;
      }
      uVar19 = _seqnum >> 0x38 | (_seqnum & 0xff000000000000) >> 0x28 |
               (_seqnum & 0xff0000000000) >> 0x18 | (_seqnum & 0xff00000000) >> 8 |
               (_seqnum & 0xff000000) << 8 | (_seqnum & 0xff0000) << 0x18 |
               (_seqnum & 0xff00) << 0x28 | _seqnum << 0x38;
      (doc->field_3).seqnum = uVar19;
      if (uVar19 <= (handle->file->pos).super___atomic_base<unsigned_long>._M_i) {
        return uVar7;
      }
      pcVar10 = 
      "File corruption: Offset %lu of the actual doc pointed by the commit marker is greater than the size %lu of a database file \'%s\'"
      ;
      sVar12 = 0x519;
      offset = (handle->file->pos).super___atomic_base<unsigned_long>._M_i;
      pcVar14 = (char *)(doc->field_3).seqnum;
    }
    else {
      sVar12 = 0x501;
      pcVar14 = handle->file->filename;
      pcVar10 = 
      "File corruption: Doc length fields in a transaction commit marker was not zero in a database file \'%s\' offset %lu"
      ;
    }
LAB_00110d0a:
    fdb_log_impl(log_callback,2,FDB_RESULT_FILE_CORRUPTION,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_read_doc",sVar12,pcVar10,pcVar14,offset);
    return -0x10;
  }
  if ((ushort)(dVar18.keylen + 0xf) < 0x10) {
    pcVar14 = (char *)(uVar19 & 0xffff);
    pcVar10 = 
    "Error in decoding the doc length metadata (key length: %d) from a database file \'%s\' offset %lu"
    ;
    sVar12 = 0x524;
    offset = (uint64_t)handle->file->filename;
    goto LAB_00110d0a;
  }
  local_80 = doc->key;
  key_alloc = local_80 == (void *)0x0;
  if (key_alloc) {
    local_80 = malloc(uVar19 & 0xffff);
    doc->key = local_80;
  }
  bVar15 = doc->meta == (void *)0x0;
  meta_alloc = uVar11 != 0 && bVar15;
  if (meta_alloc) {
    pvVar8 = malloc(uVar19 >> 0x10 & 0xffff);
    doc->meta = pvVar8;
  }
  bVar16 = doc->body == (void *)0x0;
  body_alloc = __size != 0 && bVar16;
  if (body_alloc) {
    pvVar8 = malloc(__size);
    doc->body = pvVar8;
  }
  uVar7 = _docio_read_doc_component(handle,uVar7,dVar18._0_4_ & 0xffff,local_80,log_callback);
  if ((long)uVar7 < 0) {
    uVar19 = (ulong)(doc->length).keylen;
    pfVar13 = handle->file;
    pcVar14 = "Error in reading a key with offset %lu, length %d from a database file \'%s\'";
    sVar12 = 0x53d;
LAB_00110f80:
    status = (fdb_status)uVar7;
    pcVar10 = pfVar13->filename;
  }
  else {
    uVar7 = _docio_read_doc_component(handle,uVar7,4,&_timestamp,log_callback);
    if ((long)uVar7 < 0) {
      pfVar13 = handle->file;
      pcVar14 = 
      "Error in reading a timestamp with offset %lu, length %d from a database file \'%s\'";
      sVar12 = 0x54b;
LAB_00110fb6:
      status = (fdb_status)uVar7;
      pcVar10 = pfVar13->filename;
      uVar19 = 4;
    }
    else {
      doc->timestamp =
           _timestamp >> 0x18 | (_timestamp & 0xff0000) >> 8 | (_timestamp & 0xff00) << 8 |
           _timestamp << 0x18;
      uVar7 = _docio_read_doc_component(handle,uVar7,8,&_seqnum,log_callback);
      if (-1 < (long)uVar7) {
        (doc->field_3).seqnum =
             _seqnum >> 0x38 | (_seqnum & 0xff000000000000) >> 0x28 |
             (_seqnum & 0xff0000000000) >> 0x18 | (_seqnum & 0xff00000000) >> 8 |
             (_seqnum & 0xff000000) << 8 | (_seqnum & 0xff0000) << 0x18 | (_seqnum & 0xff00) << 0x28
             | _seqnum << 0x38;
        uVar7 = _docio_read_doc_component
                          (handle,uVar7,(uint)(doc->length).metalen,doc->meta,log_callback);
        if ((long)uVar7 < 0) {
          uVar19 = (ulong)(doc->length).metalen;
          pfVar13 = handle->file;
          pcVar14 = 
          "Error in reading the doc metadata with offset %lu, length %d from a database file \'%s\'"
          ;
          sVar12 = 0x566;
        }
        else {
          uVar7 = _docio_read_doc_component
                            (handle,uVar7,(doc->length).bodylen,doc->body,log_callback);
          if (-1 < (long)uVar7) {
            uVar7 = _docio_read_doc_component(handle,uVar7,4,&crc_file,log_callback);
            if (-1 < (long)uVar7) {
              puVar1 = &(doc->length).bodylen;
              uVar6 = get_checksum((uint8_t *)&_length,0x10,handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)doc->key,(ulong)(doc->length).keylen,uVar6,
                                   handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)&_timestamp,4,uVar6,handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)&_seqnum,8,uVar6,handle->file->crc_mode);
              uVar6 = get_checksum((uint8_t *)doc->meta,(ulong)(doc->length).metalen,uVar6,
                                   handle->file->crc_mode);
              if (((doc->length).flag & 2) == 0) {
                buf = (uint8_t *)doc->body;
                puVar9 = puVar1;
              }
              else {
                puVar9 = &(doc->length).bodylen_ondisk;
                buf = (uint8_t *)0x0;
              }
              uVar6 = get_checksum(buf,(ulong)*puVar9,uVar6,handle->file->crc_mode);
              if (uVar6 != crc_file) {
                fdb_log_impl(log_callback,2,FDB_RESULT_CHECKSUM_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                             ,"docio_read_doc",0x5cd,
                             "doc_body checksum mismatch error in a database file \'%s\' crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d bodylen_ondisk %d offset %lu"
                             ,handle->file->filename,(ulong)uVar6,(ulong)crc_file,
                             (ulong)_length.keylen,(ulong)_length.metalen,(ulong)_length.bodylen,
                             (ulong)_length.bodylen_ondisk,offset);
                free_docio_object(doc,key_alloc,meta_alloc,body_alloc);
                return -0xf;
              }
              if (uVar11 != 0 && bVar15) {
                meta_alloc = (doc->length).metalen == 0;
              }
              else {
                meta_alloc = false;
              }
              if (__size != 0 && bVar16) {
                body_alloc = *puVar1 == 0;
              }
              else {
                body_alloc = false;
              }
              key_alloc = false;
              goto LAB_00111012;
            }
            pfVar13 = handle->file;
            pcVar14 = 
            "Error in reading a doc\'s CRC value with offset %lu, length %d from a database file \'%s\'"
            ;
            sVar12 = 0x59d;
            goto LAB_00110fb6;
          }
          uVar19 = (ulong)(doc->length).bodylen;
          pfVar13 = handle->file;
          pcVar14 = "Error in reading a doc with offset %lu, length %d from a database file \'%s\'";
          sVar12 = 0x58f;
        }
        goto LAB_00110f80;
      }
      pcVar14 = 
      "Error in reading a sequence number with offset %lu, length %d from a database file \'%s\'";
      sVar12 = 0x55a;
      status = (fdb_status)uVar7;
      pcVar10 = handle->file->filename;
      uVar19 = 8;
    }
  }
  fdb_log_impl(log_callback,2,status,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
               ,"docio_read_doc",sVar12,pcVar14,offset,uVar19,pcVar10);
LAB_00111012:
  free_docio_object(doc,key_alloc,meta_alloc,body_alloc);
  return uVar7;
}

Assistant:

int64_t docio_read_doc(struct docio_handle *handle, uint64_t offset,
                       struct docio_object *doc,
                       bool read_on_cache_miss)
{
    uint8_t checksum;
    int64_t _offset;
    int key_alloc = 0;
    int meta_alloc = 0;
    int body_alloc = 0;
    fdb_seqnum_t _seqnum;
    timestamp_t _timestamp;
    void *comp_body = NULL;
    struct docio_length _length, zero_length;
    err_log_callback *log_callback = handle->log_callback;

    _offset = _docio_read_length(handle, offset, &_length, log_callback,
                                 read_on_cache_miss);
    if (_offset < 0) {
        if (read_on_cache_miss) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading the doc length metadata with offset %" _F64 " from "
                    "a database file '%s'",
                    offset, handle->file->filename);
        }
        return _offset;
    }

    memset(&zero_length, 0x0, sizeof(struct docio_length));
    if (memcmp(&_length, &zero_length, sizeof(struct docio_length)) == 0) {
        // If all the fields in docio_length are zero, then it means that the rest of
        // the current block, which starts at offset, is zero-filled and can be skipped.
        doc->length = zero_length;
        return (int64_t) FDB_RESULT_SUCCESS;
    }

    // checksum check
    checksum = _docio_length_checksum(_length, handle);
    if (checksum != _length.checksum) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_length body checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                checksum, _length.checksum, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }

    doc->length = _docio_length_decode(_length);
    if (doc->length.flag & DOCIO_TXN_COMMITTED) {
        // transaction commit mark
        // read the corresponding doc offset

        // If TXN_COMMITTED flag is set, this doc is not an actual doc, but a
        // transaction commit marker. Thus, all lengths should be zero.
        if (doc->length.keylen || doc->length.metalen ||
            doc->length.bodylen || doc->length.bodylen_ondisk) {
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                    "File corruption: Doc length fields in a transaction commit marker "
                    "was not zero in a database file '%s' offset %" _F64,
                    handle->file->filename, offset);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return (int64_t) FDB_RESULT_FILE_CORRUPTION;
        }

        uint64_t doc_offset;
        _offset = _docio_read_doc_component(handle, _offset,
                                            sizeof(doc_offset), &doc_offset,
                                            log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading an offset of a committed doc from an offset %" _F64
                    " in a database file '%s'", offset, handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
        doc->doc_offset = _endian_decode(doc_offset);
        // The offset of the actual document that pointed by this commit marker
        // should not be greater than the file size.
        if (doc->doc_offset > filemgr_get_pos(handle->file)) {
            fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                    "File corruption: Offset %" _F64 " of the actual doc pointed by the "
                    "commit marker is greater than the size %" _F64 " of a database file '%s'",
                    doc->doc_offset, filemgr_get_pos(handle->file),
                    handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return (int64_t) FDB_RESULT_FILE_CORRUPTION;
        }
        return _offset;
    }

    if (doc->length.keylen == 0 || doc->length.keylen > FDB_MAX_KEYLEN_INTERNAL) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_FILE_CORRUPTION,
                "Error in decoding the doc length metadata (key length: %d) from "
                "a database file '%s' offset %" _F64, doc->length.keylen,
                handle->file->filename, offset);
        return (int64_t) FDB_RESULT_FILE_CORRUPTION;
    }

    if (doc->key == NULL) {
        doc->key = (void *)malloc(doc->length.keylen);
        key_alloc = 1;
    }
    if (doc->meta == NULL && doc->length.metalen) {
        doc->meta = (void *)malloc(doc->length.metalen);
        meta_alloc = 1;
    }
    if (doc->body == NULL && doc->length.bodylen) {
        doc->body = (void *)malloc(doc->length.bodylen);
        body_alloc = 1;
    }

    _offset = _docio_read_doc_component(handle, _offset,
                                        doc->length.keylen,
                                        doc->key,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a key with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.keylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

    // read timestamp
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(timestamp_t),
                                        &_timestamp,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a timestamp with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(timestamp_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
    doc->timestamp = _endian_decode(_timestamp);

    // copy seqeunce number (optional)
    _offset = _docio_read_doc_component(handle, _offset,
                                        sizeof(fdb_seqnum_t),
                                        (void *)&_seqnum,
                                        log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a sequence number with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(fdb_seqnum_t),
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
    doc->seqnum = _endian_decode(_seqnum);

    _offset = _docio_read_doc_component(handle, _offset, doc->length.metalen,
                                        doc->meta, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading the doc metadata with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.metalen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

#ifdef _DOC_COMP
    if (doc->length.flag & DOCIO_COMPRESSED) {
        comp_body = (void*)malloc(doc->length.bodylen_ondisk);
        _offset = _docio_read_doc_component_comp(handle, _offset, doc->length.bodylen,
                                                 doc->length.bodylen_ondisk, doc->body,
                                                 comp_body, log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading a compressed doc with offset %" _F64 ", length %d "
                    "from a database file '%s'", offset, doc->length.bodylen,
                    handle->file->filename);
            if (comp_body) {
                free(comp_body);
            }
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
    } else {
        _offset = _docio_read_doc_component(handle, _offset, doc->length.bodylen,
                                            doc->body, log_callback);
        if (_offset < 0) {
            fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                    "Error in reading a doc with offset %" _F64 ", length %d "
                    "from a database file '%s'", offset, doc->length.bodylen,
                    handle->file->filename);
            free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
            return _offset;
        }
    }
#else
    _offset = _docio_read_doc_component(handle, _offset, doc->length.bodylen,
                                        doc->body, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a doc with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, doc->length.bodylen,
                handle->file->filename);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }
#endif

#ifdef __CRC32
    uint32_t crc_file, crc;
    _offset = _docio_read_doc_component(handle, _offset, sizeof(crc_file),
                                        (void *)&crc_file, log_callback);
    if (_offset < 0) {
        fdb_log(log_callback, FDB_LOG_ERROR, (fdb_status) _offset,
                "Error in reading a doc's CRC value with offset %" _F64 ", length %d "
                "from a database file '%s'", offset, sizeof(crc_file),
                handle->file->filename);
        if (comp_body) {
            free(comp_body);
        }
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return _offset;
    }

    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_length),
                       sizeof(_length),
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->key),
                       doc->length.keylen,
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_timestamp),
                       sizeof(timestamp_t),
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(&_seqnum),
                       sizeof(fdb_seqnum_t),
                       crc,
                       handle->file->crc_mode);
    crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->meta),
                       doc->length.metalen,
                       crc,
                       handle->file->crc_mode);

    if (doc->length.flag & DOCIO_COMPRESSED) {
        crc = get_checksum(reinterpret_cast<const uint8_t*>(comp_body),
                           doc->length.bodylen_ondisk,
                           crc,
                           handle->file->crc_mode);
        if (comp_body) {
            free(comp_body);
        }
    } else {
        crc = get_checksum(reinterpret_cast<const uint8_t*>(doc->body),
                           doc->length.bodylen,
                           crc,
                           handle->file->crc_mode);
    }
    if (crc != crc_file) {
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_CHECKSUM_ERROR,
                "doc_body checksum mismatch error in a database file '%s'"
                " crc %x != %x (crc in doc) keylen %d metalen %d bodylen %d "
                "bodylen_ondisk %d offset %" _F64, handle->file->filename,
                crc, crc_file, _length.keylen, _length.metalen,
                _length.bodylen, _length.bodylen_ondisk, offset);
        free_docio_object(doc, key_alloc, meta_alloc, body_alloc);
        return (int64_t) FDB_RESULT_CHECKSUM_ERROR;
    }
#endif

    uint8_t free_meta = meta_alloc && !doc->length.metalen;
    uint8_t free_body = body_alloc && !doc->length.bodylen;
    free_docio_object(doc, 0, free_meta, free_body);

    return _offset;
}